

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O1

bool __thiscall sglr::rc::Texture3D::isComplete(Texture3D *this)

{
  PixelBufferAccess *pPVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  TextureFormat *format;
  int *piVar9;
  uint uVar10;
  size_t *psVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar8 = (ulong)uVar2;
  if ((0xd < uVar8) || ((this->m_levels).m_data[uVar8].m_cap == 0)) {
    return false;
  }
  if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
    return true;
  }
  pPVar1 = (this->m_levels).m_access + uVar8;
  uVar3 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[1];
  uVar4 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[2];
  uVar12 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
  uVar10 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar10 = uVar3;
  }
  uVar5 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[0];
  if ((int)uVar10 < (int)uVar5) {
    uVar10 = uVar5;
  }
  uVar13 = 0x20;
  if (uVar10 != 0) {
    uVar13 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 ^ 0x1f;
  }
  uVar10 = 0x20 - uVar13;
  if ((int)uVar12 < (int)(0x20 - uVar13)) {
    uVar10 = uVar12;
  }
  if (1 < (int)uVar10) {
    piVar9 = (this->m_levels).m_access[uVar8 + 1].super_ConstPixelBufferAccess.m_size.m_data + 2;
    psVar11 = &(this->m_levels).m_data[uVar8 + 1].m_cap;
    uVar8 = 1;
    do {
      if ((0xe - uVar2 == uVar8) || (*psVar11 == 0)) {
        return false;
      }
      bVar7 = (byte)uVar8;
      iVar14 = (int)uVar5 >> (bVar7 & 0x1f);
      if (iVar14 < 2) {
        iVar14 = 1;
      }
      iVar6 = (int)uVar4 >> (bVar7 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      if (((IVec3 *)(piVar9 + -2))->m_data[0] != iVar14) {
        return false;
      }
      iVar14 = (int)uVar3 >> (bVar7 & 0x1f);
      if (iVar14 < 2) {
        iVar14 = 1;
      }
      if (piVar9[-1] != iVar14) {
        return false;
      }
      if (*piVar9 != iVar6) {
        return false;
      }
      if (piVar9[-4] != (pPVar1->super_ConstPixelBufferAccess).m_format.order) {
        return false;
      }
      if (piVar9[-3] != (pPVar1->super_ConstPixelBufferAccess).m_format.type) {
        return false;
      }
      uVar8 = uVar8 + 1;
      piVar9 = piVar9 + 10;
      psVar11 = psVar11 + 2;
    } while (uVar10 != uVar8);
  }
  return true;
}

Assistant:

int							getBaseLevel	(void) const	{ return m_baseLevel;		}